

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v9::basic_memory_buffer<int,_500UL,_std::allocator<int>_>::grow
          (basic_memory_buffer<int,_500UL,_std::allocator<int>_> *this,size_t size)

{
  ulong uVar1;
  int *__src;
  size_t sVar2;
  int *__dest;
  ulong uVar3;
  ulong __n;
  
  uVar1 = (this->super_buffer<int>).capacity_;
  uVar3 = (uVar1 >> 1) + uVar1;
  __n = size;
  if (((size <= uVar3) && (__n = uVar3, uVar3 >> 0x3d != 0)) &&
     (__n = 0x1fffffffffffffff, 0x1fffffffffffffff < size)) {
    __n = size;
  }
  __src = (this->super_buffer<int>).ptr_;
  __dest = __gnu_cxx::new_allocator<int>::allocate
                     ((new_allocator<int> *)&this->field_0x7f0,__n,(void *)0x0);
  sVar2 = (this->super_buffer<int>).size_;
  if (sVar2 != 0) {
    memmove(__dest,__src,sVar2 << 2);
  }
  (this->super_buffer<int>).ptr_ = __dest;
  (this->super_buffer<int>).capacity_ = __n;
  if (__src == this->store_) {
    return;
  }
  operator_delete(__src,uVar1 << 2);
  return;
}

Assistant:

FMT_CONSTEXPR20 void basic_memory_buffer<T, SIZE, Allocator>::grow(
    size_t size) {
  detail::abort_fuzzing_if(size > 5000);
  const size_t max_size = std::allocator_traits<Allocator>::max_size(alloc_);
  size_t old_capacity = this->capacity();
  size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity)
    new_capacity = size;
  else if (new_capacity > max_size)
    new_capacity = size > max_size ? size : max_size;
  T* old_data = this->data();
  T* new_data =
      std::allocator_traits<Allocator>::allocate(alloc_, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          detail::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_) alloc_.deallocate(old_data, old_capacity);
}